

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Session::Session(Session *this)

{
  ConfigData *this_00;
  Config *pCVar1;
  int iVar2;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar3;
  undefined4 extraout_var;
  Context *pCVar5;
  IStream *pIVar6;
  undefined4 extraout_var_00;
  ostream *poVar7;
  undefined8 uVar8;
  unique_ptr<Catch::IStream> errStream;
  exception_ptr local_d0;
  unique_ptr<Catch::ColourImpl> colourImpl;
  ColourGuard guard;
  ReusableStringStream local_b0 [2];
  Parser local_90;
  long *plVar4;
  
  Clara::Parser::Parser(&this->m_cli);
  this_00 = &this->m_configData;
  ConfigData::ConfigData(this_00);
  (this->m_config).m_ptr = (Config *)0x0;
  this->m_startupExceptions = false;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream(local_b0);
    guard.m_colourImpl = (ColourImpl *)anon_var_dwarf_37041;
    guard.m_code = 0x476;
    guard.m_engaged = false;
    guard._13_3_ = 0;
    Catch::operator<<(local_b0[0].m_oss,(SourceLineInfo *)&guard);
    std::operator<<(local_b0[0].m_oss,": Internal Catch2 error: ");
    std::operator<<(local_b0[0].m_oss,"Only one instance of Catch::Session can ever be used");
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_90);
  }
  pSVar3 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar3->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar3);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (*plVar4 != plVar4[1]) {
    config(this);
    pCVar5 = getCurrentMutableContext();
    pCVar5->m_config = &((this->m_config).m_ptr)->super_IConfig;
    this->m_startupExceptions = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"%stderr",(allocator<char> *)local_b0);
    makeStream((Catch *)&errStream,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    makeColourImpl((Catch *)&colourImpl,PlatformDefault,errStream.m_ptr);
    guard.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(&colourImpl);
    guard.m_code = Red;
    guard.m_engaged = false;
    pIVar6 = Detail::unique_ptr<Catch::IStream>::operator->(&errStream);
    iVar2 = (*pIVar6->_vptr_IStream[2])(pIVar6);
    poVar7 = std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),
                             "Errors occurred during startup!");
    std::operator<<(poVar7,'\n');
    if ((exception_ptr *)*plVar4 != (exception_ptr *)plVar4[1]) {
      std::__exception_ptr::exception_ptr::exception_ptr(&local_d0,(exception_ptr *)*plVar4);
      uVar8 = std::rethrow_exception((exception_ptr)&local_d0);
      ColourImpl::ColourGuard::~ColourGuard(&guard);
      if (colourImpl.m_ptr != (ColourImpl *)0x0) {
        (*(colourImpl.m_ptr)->_vptr_ColourImpl[1])();
      }
      if (errStream.m_ptr != (IStream *)0x0) {
        (*(errStream.m_ptr)->_vptr_IStream[1])();
      }
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      ConfigData::~ConfigData(this_00);
      Clara::Parser::~Parser(&this->m_cli);
      _Unwind_Resume(uVar8);
    }
    ColourImpl::ColourGuard::~ColourGuard(&guard);
    if (colourImpl.m_ptr != (ColourImpl *)0x0) {
      (*(colourImpl.m_ptr)->_vptr_ColourImpl[1])();
    }
    if (errStream.m_ptr != (IStream *)0x0) {
      (*(errStream.m_ptr)->_vptr_IStream[1])();
    }
  }
  Session()::alreadyInstantiated = '\x01';
  makeCommandLineParser(&local_90,this_00);
  Clara::Parser::operator=(&this->m_cli,&local_90);
  Clara::Parser::~Parser(&local_90);
  return;
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }